

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Samba.cpp
# Opt level: O0

ssize_t __thiscall Samba::read(Samba *this,int __fd,void *__buf,size_t __nbytes)

{
  uint8_t uVar1;
  uint uVar2;
  int iVar3;
  pointer pSVar5;
  SambaError *this_00;
  uint local_3c;
  char local_38 [4];
  int chunk;
  uint8_t cmd [20];
  int size_local;
  uint8_t *buffer_local;
  uint32_t addr_local;
  Samba *this_local;
  Samba *pSVar4;
  
  cmd._12_4_ = (undefined4)__nbytes;
  unique0x100001c0 = (Samba *)__buf;
  if ((this->_debug & 1U) != 0) {
    printf("%s(addr=%#x,size=%#x)\n","read",(ulong)(uint)__fd,__nbytes & 0xffffffff);
  }
  pSVar4 = this;
  buffer_local._4_4_ = __fd;
  if (((((this->_isUsb & 1U) != 0) && (this->_readBufferSize == 0)) && (0x20 < (int)cmd._12_4_)) &&
     (uVar2 = cmd._12_4_ & cmd._12_4_ - 1, pSVar4 = (Samba *)(ulong)uVar2, uVar2 == 0)) {
    uVar1 = readByte(this,__fd);
    *(uint8_t *)&stack0xffffffffffffffe0->_vptr_Samba = uVar1;
    buffer_local._4_4_ = __fd + 1;
    register0x00000000 = (Samba *)((long)&stack0xffffffffffffffe0->_vptr_Samba + 1);
    cmd._12_4_ = cmd._12_4_ - 1;
    pSVar4 = (Samba *)(ulong)(uint)cmd._12_4_;
  }
  while( true ) {
    if ((int)cmd._12_4_ < 1) {
      return (ssize_t)pSVar4;
    }
    if ((this->_readBufferSize < 1) || ((int)cmd._12_4_ <= this->_readBufferSize)) {
      local_3c._0_1_ = cmd[0xc];
      local_3c._1_1_ = cmd[0xd];
      local_3c._2_1_ = cmd[0xe];
      local_3c._3_1_ = cmd[0xf];
    }
    else {
      local_3c = this->_readBufferSize;
    }
    snprintf(local_38,0x14,"R%08X,%08X#",(ulong)buffer_local._4_4_,(ulong)local_3c);
    pSVar5 = std::unique_ptr<SerialPort,_std::default_delete<SerialPort>_>::operator->(&this->_port)
    ;
    iVar3 = (*pSVar5->_vptr_SerialPort[6])(pSVar5,local_38,0x13);
    if (iVar3 != 0x13) break;
    if ((this->_isUsb & 1U) == 0) {
      readXmodem(this,(uint8_t *)stack0xffffffffffffffe0,local_3c);
    }
    else {
      readBinary(this,(uint8_t *)stack0xffffffffffffffe0,local_3c);
    }
    cmd._12_4_ = cmd._12_4_ - local_3c;
    buffer_local._4_4_ = local_3c + buffer_local._4_4_;
    register0x00000000 =
         (Samba *)((long)&stack0xffffffffffffffe0->_vptr_Samba + (long)(int)local_3c);
    pSVar4 = register0x00000000;
  }
  this_00 = (SambaError *)__cxa_allocate_exception(8);
  SambaError::SambaError(this_00);
  __cxa_throw(this_00,&SambaError::typeinfo,SambaError::~SambaError);
}

Assistant:

void
Samba::read(uint32_t addr, uint8_t* buffer, int size)
{
    uint8_t cmd[20];
    int chunk;

    if (_debug)
        printf("%s(addr=%#x,size=%#x)\n", __FUNCTION__, addr, size);

    // The SAM firmware has a bug reading powers of 2 over 32 bytes
    // via USB.  If that is the case here, then read the first byte
    // with a readByte and then read one less than the requested size.
    if (_isUsb && _readBufferSize == 0 && size > 32 && !(size & (size - 1)))
    {
        *buffer = readByte(addr);
        addr++;
        buffer++;
        size--;
    }

    while (size > 0)
    {
        // Handle any limitations on the size of the read
        if (_readBufferSize > 0 && size > _readBufferSize)
            chunk = _readBufferSize;
        else
            chunk = size;

        snprintf((char*) cmd, sizeof(cmd), "R%08X,%08X#", addr, chunk);
        if (_port->write(cmd, sizeof(cmd) - 1) != sizeof(cmd) - 1)
            throw SambaError();

        if (_isUsb)
            readBinary(buffer, chunk);
        else
            readXmodem(buffer, chunk);

        size -= chunk;
        addr += chunk;
        buffer += chunk;
    }
}